

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

void opj_tls_destroy(opj_tls_t *tls)

{
  int local_14;
  int i;
  opj_tls_t *tls_local;
  
  if (tls != (opj_tls_t *)0x0) {
    for (local_14 = 0; local_14 < tls->key_val_count; local_14 = local_14 + 1) {
      if (tls->key_val[local_14].opj_free_func != (opj_tls_free_func)0x0) {
        (*tls->key_val[local_14].opj_free_func)(tls->key_val[local_14].value);
      }
    }
    opj_free(tls->key_val);
    opj_free(tls);
  }
  return;
}

Assistant:

static void opj_tls_destroy(opj_tls_t* tls)
{
    int i;
    if (!tls) {
        return;
    }
    for (i = 0; i < tls->key_val_count; i++) {
        if (tls->key_val[i].opj_free_func) {
            tls->key_val[i].opj_free_func(tls->key_val[i].value);
        }
    }
    opj_free(tls->key_val);
    opj_free(tls);
}